

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

bsc_step_t
bsc_reduce_2tree_multiple
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  undefined8 *puVar1;
  bsc_step_t bVar2;
  long lVar3;
  
  bVar2 = depends;
  if (0 < n) {
    lVar3 = 0;
    do {
      puVar1 = (undefined8 *)((long)&params->reducer + lVar3);
      bVar2 = bsc_reduce_qtree_single
                        (depends,root,group,*(void **)((long)&params->src + lVar3),
                         *(void **)((long)&params->dst + lVar3),
                         *(void **)((long)&params->tmp + lVar3),(bsc_reduce_t)*puVar1,
                         (void *)puVar1[1],*(bsc_size_t *)((long)&params->nmemb + lVar3),
                         *(bsc_size_t *)((long)&params->size + lVar3),2);
      lVar3 = lVar3 + 0x30;
    } while ((ulong)(uint)n * 0x30 != lVar3);
  }
  return bVar2;
}

Assistant:

bsc_step_t bsc_reduce_2tree_multiple( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    bsc_size_t i;
    bsc_step_t finished = depends;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_reduce_qtree_single( depends, root, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, 2 );
    }

    return finished;
}